

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O2

void __thiscall duckdb::WriteLogBindData::WriteLogBindData(WriteLogBindData *this)

{
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__WriteLogBindData_01796d40;
  this->disable_logging = false;
  (this->scope)._M_dataplus._M_p = (pointer)&(this->scope).field_2;
  (this->scope)._M_string_length = 0;
  (this->scope).field_2._M_local_buf[0] = '\0';
  this->level = LOG_INFO;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->context).ptr = (ClientContext *)0x0;
  this->output_col = 0xffffffffffffffff;
  LogicalType::LogicalType(&this->return_type);
  return;
}

Assistant:

explicit WriteLogBindData() {}